

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall
backward::Printer::print_source_loc
          (Printer *this,ostream *os,char *indent,SourceLoc *source_loc,void *addr)

{
  ostream *poVar1;
  string *in_RCX;
  char *in_RDX;
  ostream *in_RSI;
  long in_RDI;
  void *in_R8;
  
  poVar1 = std::operator<<(in_RSI,in_RDX);
  poVar1 = std::operator<<(poVar1,"Source \"");
  poVar1 = std::operator<<(poVar1,in_RCX + 0x20);
  poVar1 = std::operator<<(poVar1,"\", line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RCX + 0x40));
  poVar1 = std::operator<<(poVar1,", in ");
  std::operator<<(poVar1,in_RCX);
  if (((*(byte *)(in_RDI + 8) & 1) != 0) && (in_R8 != (void *)0x0)) {
    poVar1 = std::operator<<(in_RSI," [");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_R8);
    std::operator<<(poVar1,"]");
  }
  std::operator<<(in_RSI,"\n");
  return;
}

Assistant:

void print_source_loc(std::ostream &os, const char *indent,
                        const ResolvedTrace::SourceLoc &source_loc,
                        void *addr = nullptr) {
    os << indent << "Source \"" << source_loc.filename << "\", line "
       << source_loc.line << ", in " << source_loc.function;

    if (address && addr != nullptr) {
      os << " [" << addr << "]";
    }
    os << "\n";
  }